

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void event_night_time(tgestate_t *state)

{
  if (state->hero_in_bed == '\0') {
    set_hero_route(state,&event_night_time::t);
  }
  set_day_or_night(state,0xff);
  return;
}

Assistant:

static void event_night_time(tgestate_t *state)
{
  assert(state != NULL);

  if (state->hero_in_bed == 0)
  {
    static const route_t t = { routeindex_44_HUT2_RIGHT_TO_LEFT, 1 }; /* was BC */
    set_hero_route(state, &t);
  }
  set_day_or_night(state, 255);
}